

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recalc.cpp
# Opt level: O1

void __thiscall Simplex::printTableau(Simplex *this,bool full)

{
  uint uVar1;
  IndexVal **ppIVar2;
  int *piVar3;
  IndexVal *pIVar4;
  int iVar5;
  void *pvVar6;
  long lVar7;
  void *pvVar8;
  void *pvVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  longdouble *plVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  longdouble lVar17;
  
  calcRHS(this);
  lVar10 = (long)this->m + (long)this->n;
  uVar15 = lVar10 * 0x10;
  if ((int)lVar10 < 0) {
    uVar15 = 0xffffffffffffffff;
  }
  pvVar6 = operator_new__(uVar15);
  fwrite("Tableau:\n",9,1,_stderr);
  iVar5 = this->m + this->n;
  if (iVar5 != 0 && SCARRY4(this->m,this->n) == iVar5 < 0) {
    uVar15 = 0;
    do {
      fprintf(_stderr,"%d:%d ",uVar15 & 0xffffffff,(ulong)(uint)this->shift[uVar15]);
      uVar15 = uVar15 + 1;
    } while ((long)uVar15 < (long)this->m + (long)this->n);
  }
  fputc(10,_stderr);
  if (0 < this->m) {
    lVar10 = 0;
    do {
      calcBInvRow(this,(longdouble *)((long)this->n * 0x10 + (long)pvVar6),(int)lVar10);
      lVar7 = (long)this->n;
      if (0 < lVar7) {
        ppIVar2 = this->AV;
        piVar3 = this->AV_nz;
        lVar12 = 0;
        do {
          *(longdouble *)((long)pvVar6 + lVar12 * 0x10) = (longdouble)0;
          iVar5 = piVar3[lVar12];
          if (0 < (long)iVar5) {
            plVar13 = (longdouble *)(lVar12 * 0x10 + (long)pvVar6);
            pIVar4 = ppIVar2[lVar12];
            lVar17 = *plVar13;
            lVar14 = 0;
            do {
              lVar17 = *(longdouble *)((long)&pIVar4->field_0 + lVar14) *
                       *(longdouble *)
                        ((long)pvVar6 +
                        (*(int *)((long)&pIVar4->field_0 + lVar14 + 0xc) + lVar7) * 0x10) + lVar17;
              *plVar13 = lVar17;
              lVar14 = lVar14 + 0x10;
            } while ((long)iVar5 * 0x10 != lVar14);
          }
          lVar12 = lVar12 + 1;
        } while (lVar12 != lVar7);
      }
      fprintf(_stderr,"%d: ",(ulong)(uint)this->rtoc[lVar10]);
      if ((full) && (iVar5 = this->m + this->n, iVar5 != 0 && SCARRY4(this->m,this->n) == iVar5 < 0)
         ) {
        uVar15 = 0;
        do {
          fprintf(_stderr,"%d:%.3Lf ",uVar15 & 0xffffffff);
          uVar15 = uVar15 + 1;
        } while ((long)uVar15 < (long)this->m + (long)this->n);
      }
      fprintf(_stderr,"rhs:%.18Lf");
      fputc(10,_stderr);
      lVar10 = lVar10 + 1;
    } while (lVar10 < this->m);
  }
  printObjective(this);
  fflush(_stderr);
  iVar5 = this->m;
  uVar16 = (long)this->n + (long)iVar5;
  uVar15 = uVar16 * 8;
  if ((int)uVar16 < 0) {
    uVar15 = 0xffffffffffffffff;
  }
  pvVar8 = operator_new__(uVar15);
  if (0 < (int)uVar16) {
    uVar15 = (long)iVar5 << 4;
    if (iVar5 < 0) {
      uVar15 = 0xffffffffffffffff;
    }
    uVar11 = 0;
    do {
      pvVar9 = operator_new__(uVar15);
      *(void **)((long)pvVar8 + uVar11 * 8) = pvVar9;
      uVar11 = uVar11 + 1;
    } while ((uVar16 & 0xffffffff) != uVar11);
  }
  uVar1 = this->m;
  uVar15 = (ulong)uVar1;
  iVar5 = this->n + uVar1;
  if (iVar5 != 0 && SCARRY4(this->n,uVar1) == iVar5 < 0) {
    lVar10 = 0;
    do {
      if (0 < (int)uVar15) {
        lVar7 = *(long *)((long)pvVar8 + lVar10 * 8);
        lVar12 = 0;
        do {
          *(longdouble *)(lVar7 + lVar12) = (longdouble)0;
          lVar12 = lVar12 + 0x10;
        } while ((uVar15 & 0xffffffff) << 4 != lVar12);
      }
      iVar5 = this->AV_nz[lVar10];
      if (0 < (long)iVar5) {
        pIVar4 = this->AV[lVar10];
        lVar7 = *(long *)((long)pvVar8 + lVar10 * 8);
        lVar12 = 0;
        do {
          *(unkbyte10 *)(lVar7 + (long)*(int *)((long)&pIVar4->field_0 + lVar12 + 0xc) * 0x10) =
               *(unkbyte10 *)((long)&pIVar4->field_0 + lVar12);
          lVar12 = lVar12 + 0x10;
        } while ((long)iVar5 * 0x10 != lVar12);
      }
      Bmultiply(this,*(longdouble **)((long)pvVar8 + lVar10 * 8));
      lVar10 = lVar10 + 1;
      uVar15 = (ulong)this->m;
    } while (lVar10 < (long)((long)this->n + uVar15));
  }
  if (0 < this->m) {
    lVar10 = 0;
    do {
      fprintf(_stderr,"%d: ",(ulong)(uint)this->rtoc[lVar10]);
      iVar5 = this->m + this->n;
      if (iVar5 != 0 && SCARRY4(this->m,this->n) == iVar5 < 0) {
        uVar15 = 0;
        do {
          fprintf(_stderr,"%d:%.3Lf ",uVar15 & 0xffffffff);
          uVar15 = uVar15 + 1;
        } while ((long)uVar15 < (long)this->m + (long)this->n);
      }
      fputc(10,_stderr);
      lVar10 = lVar10 + 1;
    } while (lVar10 < this->m);
  }
  operator_delete__(pvVar6);
  iVar5 = this->m + this->n;
  if (iVar5 != 0 && SCARRY4(this->m,this->n) == iVar5 < 0) {
    lVar10 = 0;
    do {
      pvVar6 = *(void **)((long)pvVar8 + lVar10 * 8);
      if (pvVar6 != (void *)0x0) {
        operator_delete(pvVar6);
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < (long)this->m + (long)this->n);
  }
  operator_delete__(pvVar8);
  return;
}

Assistant:

void Simplex::printTableau(bool full) {
	calcRHS();
	//	long double row[n+m];
	auto* row = new long double[n + m];
	fprintf(stderr, "Tableau:\n");
	for (int i = 0; i < n + m; i++) {
		fprintf(stderr, "%d:%d ", i, shift[i]);
	}
	fprintf(stderr, "\n");
	for (int i = 0; i < m; i++) {
		calcBInvRow(&row[n], i);
		for (int j = 0; j < n; j++) {
			row[j] = 0;
			for (int k = 0; k < AV_nz[j]; k++) {
				row[j] += row[n + AV[j][k].index()] * AV[j][k].val();
			}
		}
		fprintf(stderr, "%d: ", rtoc[i]);
		if (full) {
			for (int j = 0; j < n + m; j++) {
				fprintf(stderr, "%d:%.3Lf ", j, row[j]);
			}
		}
		fprintf(stderr, "rhs:%.18Lf", rhs[i]);
		fprintf(stderr, "\n");
		//		row[rtoc[i]] -= 1;
		//		for (int j = 0; j < m; j++) {
		//			if (!almostZero6(row[rtoc[j]])) fprintf(stderr, "%d:%d:%.2Lf ", i, j, row[rtoc[j]]);
		//			assert(almostZero6(row[rtoc[j]]));
		//		}
	}
	printObjective();
	fflush(stderr);

	//	long double T[n+m][m];
	auto** T = new long double*[n + m];
	for (int i = 0; i < n + m; i++) {
		T[i] = new long double[m];
	}
	for (int i = 0; i < n + m; i++) {
		for (int j = 0; j < m; j++) {
			T[i][j] = 0;
		}
		for (int j = 0; j < AV_nz[i]; j++) {
			T[i][AV[i][j].index()] = AV[i][j].val();
		}
		Bmultiply(T[i]);
	}

	for (int i = 0; i < m; i++) {
		fprintf(stderr, "%d: ", rtoc[i]);
		for (int j = 0; j < n + m; j++) {
			fprintf(stderr, "%d:%.3Lf ", j, T[j][i]);
		}
		fprintf(stderr, "\n");
	}

	delete[] row;
	for (int i = 0; i < n + m; i++) {
		delete T[i];
	}
	delete[] T;
}